

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

void __thiscall
PartiallySignedTransaction::PartiallySignedTransaction
          (PartiallySignedTransaction *this,CMutableTransaction *tx)

{
  long lVar1;
  size_type in_RDI;
  vector<PSBTInput,_std::allocator<PSBTInput>_> *this_00;
  long in_FS_OFFSET;
  set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
  *in_stack_ffffffffffffff88;
  CMutableTransaction *in_stack_ffffffffffffff90;
  optional<CMutableTransaction> *in_stack_ffffffffffffff98;
  size_type __new_size;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __new_size = in_RDI;
  std::optional<CMutableTransaction>::optional<const_CMutableTransaction_&,_true>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  this_00 = (vector<PSBTInput,_std::allocator<PSBTInput>_> *)(in_RDI + 0x40);
  std::
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  ::map((map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
         *)in_stack_ffffffffffffff88);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::vector
            ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_ffffffffffffff88);
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::vector
            ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)in_stack_ffffffffffffff88);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff88);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)in_stack_ffffffffffffff88);
  std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::set
            (in_stack_ffffffffffffff88);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::size
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff88);
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::resize(this_00,__new_size);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::size
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff88);
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::resize
            ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)this_00,__new_size);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PartiallySignedTransaction::PartiallySignedTransaction(const CMutableTransaction& tx) : tx(tx)
{
    inputs.resize(tx.vin.size());
    outputs.resize(tx.vout.size());
}